

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O1

int glfwGetError(char **description)

{
  _GLFWerror *p_Var1;
  int iVar2;
  
  if (description != (char **)0x0) {
    *description = (char *)0x0;
  }
  if (_glfw.initialized == 0) {
    p_Var1 = &_glfwMainThreadError;
  }
  else {
    p_Var1 = (_GLFWerror *)_glfwPlatformGetTls(&_glfw.errorSlot);
  }
  if (p_Var1 == (_GLFWerror *)0x0) {
    iVar2 = 0;
  }
  else {
    iVar2 = p_Var1->code;
    p_Var1->code = 0;
    if (iVar2 != 0 && description != (char **)0x0) {
      *description = p_Var1->description;
    }
  }
  return iVar2;
}

Assistant:

GLFWAPI int glfwGetError(const char** description)
{
    _GLFWerror* error;
    int code = GLFW_NO_ERROR;

    if (description)
        *description = NULL;

    if (_glfw.initialized)
        error = _glfwPlatformGetTls(&_glfw.errorSlot);
    else
        error = &_glfwMainThreadError;

    if (error)
    {
        code = error->code;
        error->code = GLFW_NO_ERROR;
        if (description && code)
            *description = error->description;
    }

    return code;
}